

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

wostream * mjs::operator<<(wostream *os,token_type t)

{
  wostream *pwVar1;
  ostringstream oss;
  char *local_1b0 [4];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  operator<<((ostream *)local_190,t);
  std::__cxx11::stringbuf::str();
  pwVar1 = std::operator<<(os,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return pwVar1;
}

Assistant:

std::wostream& operator<<(std::wostream& os, token_type t) {
    std::ostringstream oss;
    oss << t;
    return os << oss.str().c_str();
}